

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void I422ToRGB24Row_SSSE3
               (uint8_t *y_buf,uint8_t *u_buf,uint8_t *v_buf,uint8_t *dst_rgb24,
               YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  char cVar9;
  char cVar10;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar34 [32];
  undefined8 uVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  undefined6 uVar60;
  undefined1 auVar61 [14];
  undefined1 auVar62 [12];
  unkbyte10 Var63;
  undefined1 auVar64 [14];
  undefined1 auVar65 [12];
  unkbyte10 Var66;
  unkbyte9 Var67;
  unkbyte9 Var68;
  undefined6 uVar69;
  uvec8 auVar70;
  uvec8 auVar71;
  long lVar72;
  int iVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar95 [16];
  int width_local;
  YuvConstants *yuvconstants_local;
  uint8_t *dst_rgb24_local;
  uint8_t *v_buf_local;
  uint8_t *u_buf_local;
  uint8_t *y_buf_local;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined2 uVar81;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 uVar96;
  
  auVar71 = libyuv::kShuffleMaskARGBToRGB24_0;
  auVar70 = libyuv::kShuffleMaskARGBToRGB24;
  auVar2 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar4 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar36 = yuvconstants->kUVBiasB[0];
  sVar37 = yuvconstants->kUVBiasB[1];
  sVar38 = yuvconstants->kUVBiasB[2];
  sVar39 = yuvconstants->kUVBiasB[3];
  sVar40 = yuvconstants->kUVBiasB[4];
  sVar41 = yuvconstants->kUVBiasB[5];
  sVar42 = yuvconstants->kUVBiasB[6];
  sVar43 = yuvconstants->kUVBiasB[7];
  sVar44 = yuvconstants->kUVBiasG[0];
  sVar45 = yuvconstants->kUVBiasG[1];
  sVar46 = yuvconstants->kUVBiasG[2];
  sVar47 = yuvconstants->kUVBiasG[3];
  sVar48 = yuvconstants->kUVBiasG[4];
  sVar49 = yuvconstants->kUVBiasG[5];
  sVar50 = yuvconstants->kUVBiasG[6];
  sVar51 = yuvconstants->kUVBiasG[7];
  sVar52 = yuvconstants->kUVBiasR[0];
  sVar53 = yuvconstants->kUVBiasR[1];
  sVar54 = yuvconstants->kUVBiasR[2];
  sVar55 = yuvconstants->kUVBiasR[3];
  sVar56 = yuvconstants->kUVBiasR[4];
  sVar57 = yuvconstants->kUVBiasR[5];
  sVar58 = yuvconstants->kUVBiasR[6];
  sVar59 = yuvconstants->kUVBiasR[7];
  auVar5 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  lVar72 = (long)v_buf - (long)u_buf;
  do {
    uVar6 = *(undefined4 *)u_buf;
    uVar7 = *(undefined4 *)(u_buf + lVar72);
    u_buf = u_buf + 4;
    uVar81 = CONCAT11((char)((uint)uVar7 >> 0x18),(char)((uint)uVar6 >> 0x18));
    uVar35 = CONCAT35(CONCAT21(uVar81,(char)((uint)uVar7 >> 0x10)),
                      CONCAT14((char)((uint)uVar6 >> 0x10),uVar6));
    uVar60 = CONCAT51(CONCAT41((int)((ulong)uVar35 >> 0x20),(char)((uint)uVar7 >> 8)),
                      (char)((uint)uVar6 >> 8));
    auVar86._0_2_ = CONCAT11((char)uVar7,(char)uVar6);
    uVar1 = CONCAT62(uVar60,auVar86._0_2_);
    auVar74._8_4_ = 0;
    auVar74._0_8_ = uVar1;
    auVar74._12_2_ = uVar81;
    auVar74._14_2_ = uVar81;
    uVar81 = (undefined2)((ulong)uVar35 >> 0x20);
    auVar95._12_4_ = auVar74._12_4_;
    auVar95._8_2_ = 0;
    auVar95._0_8_ = uVar1;
    auVar95._10_2_ = uVar81;
    auVar82._10_6_ = auVar95._10_6_;
    auVar82._8_2_ = uVar81;
    auVar82._0_8_ = uVar1;
    uVar81 = (undefined2)uVar60;
    auVar86._8_8_ = auVar82._8_8_;
    auVar86._6_2_ = uVar81;
    auVar86._4_2_ = uVar81;
    auVar86._2_2_ = auVar86._0_2_;
    uVar1 = *(ulong *)y_buf;
    uVar96 = (undefined1)(uVar1 >> 0x38);
    auVar94._8_6_ = 0;
    auVar94._0_8_ = uVar1;
    auVar94[0xe] = uVar96;
    auVar94[0xf] = uVar96;
    uVar96 = (undefined1)(uVar1 >> 0x30);
    auVar93._14_2_ = auVar94._14_2_;
    auVar93._8_5_ = 0;
    auVar93._0_8_ = uVar1;
    auVar93[0xd] = uVar96;
    auVar92._13_3_ = auVar93._13_3_;
    auVar92._8_4_ = 0;
    auVar92._0_8_ = uVar1;
    auVar92[0xc] = uVar96;
    uVar96 = (undefined1)(uVar1 >> 0x28);
    auVar91._12_4_ = auVar92._12_4_;
    auVar91._8_3_ = 0;
    auVar91._0_8_ = uVar1;
    auVar91[0xb] = uVar96;
    auVar90._11_5_ = auVar91._11_5_;
    auVar90._8_2_ = 0;
    auVar90._0_8_ = uVar1;
    auVar90[10] = uVar96;
    uVar96 = (undefined1)(uVar1 >> 0x20);
    auVar89._10_6_ = auVar90._10_6_;
    auVar89[8] = 0;
    auVar89._0_8_ = uVar1;
    auVar89[9] = uVar96;
    auVar88._9_7_ = auVar89._9_7_;
    auVar88[8] = uVar96;
    auVar88._0_8_ = uVar1;
    uVar96 = (undefined1)(uVar1 >> 0x18);
    auVar87._8_8_ = auVar88._8_8_;
    auVar87[7] = uVar96;
    auVar87[6] = uVar96;
    uVar96 = (undefined1)(uVar1 >> 0x10);
    auVar87[5] = uVar96;
    auVar87[4] = uVar96;
    uVar96 = (undefined1)(uVar1 >> 8);
    auVar87[3] = uVar96;
    auVar87[2] = uVar96;
    auVar87[0] = (undefined1)uVar1;
    auVar87[1] = auVar87[0];
    y_buf = (uint8_t *)((long)y_buf + 8);
    auVar82 = pmaddubsw(auVar86,auVar2);
    auVar75._0_2_ = sVar36 - auVar82._0_2_;
    auVar75._2_2_ = sVar37 - auVar82._2_2_;
    auVar75._4_2_ = sVar38 - auVar82._4_2_;
    auVar75._6_2_ = sVar39 - auVar82._6_2_;
    auVar75._8_2_ = sVar40 - auVar82._8_2_;
    auVar75._10_2_ = sVar41 - auVar82._10_2_;
    auVar75._12_2_ = sVar42 - auVar82._12_2_;
    auVar75._14_2_ = sVar43 - auVar82._14_2_;
    auVar82 = pmaddubsw(auVar86,auVar3);
    auVar83._0_2_ = sVar44 - auVar82._0_2_;
    auVar83._2_2_ = sVar45 - auVar82._2_2_;
    auVar83._4_2_ = sVar46 - auVar82._4_2_;
    auVar83._6_2_ = sVar47 - auVar82._6_2_;
    auVar83._8_2_ = sVar48 - auVar82._8_2_;
    auVar83._10_2_ = sVar49 - auVar82._10_2_;
    auVar83._12_2_ = sVar50 - auVar82._12_2_;
    auVar83._14_2_ = sVar51 - auVar82._14_2_;
    auVar86 = pmaddubsw(auVar86,auVar4);
    auVar85._0_2_ = sVar52 - auVar86._0_2_;
    auVar85._2_2_ = sVar53 - auVar86._2_2_;
    auVar85._4_2_ = sVar54 - auVar86._4_2_;
    auVar85._6_2_ = sVar55 - auVar86._6_2_;
    auVar85._8_2_ = sVar56 - auVar86._8_2_;
    auVar85._10_2_ = sVar57 - auVar86._10_2_;
    auVar85._12_2_ = sVar58 - auVar86._12_2_;
    auVar85._14_2_ = sVar59 - auVar86._14_2_;
    auVar95 = pmulhuw(auVar87,auVar5);
    auVar86 = paddsw(auVar75,auVar95);
    auVar82 = paddsw(auVar83,auVar95);
    auVar95 = paddsw(auVar85,auVar95);
    auVar86 = psraw(auVar86,6);
    auVar82 = psraw(auVar82,6);
    auVar95 = psraw(auVar95,6);
    sVar18 = auVar86._0_2_;
    sVar20 = auVar86._2_2_;
    sVar22 = auVar86._4_2_;
    sVar24 = auVar86._6_2_;
    sVar26 = auVar86._8_2_;
    sVar28 = auVar86._10_2_;
    sVar30 = auVar86._12_2_;
    sVar32 = auVar86._14_2_;
    cVar9 = (0 < sVar32) * (sVar32 < 0x100) * auVar86[0xe] - (0xff < sVar32);
    sVar32 = auVar82._0_2_;
    sVar21 = auVar82._2_2_;
    sVar23 = auVar82._4_2_;
    sVar25 = auVar82._6_2_;
    sVar27 = auVar82._8_2_;
    sVar29 = auVar82._10_2_;
    sVar31 = auVar82._12_2_;
    sVar33 = auVar82._14_2_;
    sVar19 = auVar95._0_2_;
    cVar10 = (0 < sVar19) * (sVar19 < 0x100) * auVar95[0] - (0xff < sVar19);
    sVar19 = auVar95._2_2_;
    cVar11 = (0 < sVar19) * (sVar19 < 0x100) * auVar95[2] - (0xff < sVar19);
    sVar19 = auVar95._4_2_;
    cVar12 = (0 < sVar19) * (sVar19 < 0x100) * auVar95[4] - (0xff < sVar19);
    sVar19 = auVar95._6_2_;
    cVar13 = (0 < sVar19) * (sVar19 < 0x100) * auVar95[6] - (0xff < sVar19);
    sVar19 = auVar95._8_2_;
    cVar14 = (0 < sVar19) * (sVar19 < 0x100) * auVar95[8] - (0xff < sVar19);
    sVar19 = auVar95._10_2_;
    cVar15 = (0 < sVar19) * (sVar19 < 0x100) * auVar95[10] - (0xff < sVar19);
    sVar19 = auVar95._12_2_;
    cVar16 = (0 < sVar19) * (sVar19 < 0x100) * auVar95[0xc] - (0xff < sVar19);
    sVar19 = auVar95._14_2_;
    cVar17 = (0 < sVar19) * (sVar19 < 0x100) * auVar95[0xe] - (0xff < sVar19);
    uVar81 = CONCAT11((0 < sVar33) * (sVar33 < 0x100) * auVar82[0xe] - (0xff < sVar33),cVar9);
    uVar6 = CONCAT31(CONCAT21(uVar81,(0 < sVar31) * (sVar31 < 0x100) * auVar82[0xc] -
                                     (0xff < sVar31)),
                     (0 < sVar30) * (sVar30 < 0x100) * auVar86[0xc] - (0xff < sVar30));
    uVar60 = CONCAT51(CONCAT41(uVar6,(0 < sVar29) * (sVar29 < 0x100) * auVar82[10] - (0xff < sVar29)
                              ),(0 < sVar28) * (sVar28 < 0x100) * auVar86[10] - (0xff < sVar28));
    Var67 = CONCAT72(CONCAT61(uVar60,(0 < sVar27) * (sVar27 < 0x100) * auVar82[8] - (0xff < sVar27))
                     ,CONCAT11((0 < sVar26) * (sVar26 < 0x100) * auVar86[8] - (0xff < sVar26),cVar9)
                    );
    Var63 = CONCAT91(CONCAT81((long)((unkuint9)Var67 >> 8),
                              (0 < sVar25) * (sVar25 < 0x100) * auVar82[6] - (0xff < sVar25)),
                     (0 < sVar24) * (sVar24 < 0x100) * auVar86[6] - (0xff < sVar24));
    auVar62._2_10_ = Var63;
    auVar62[1] = (0 < sVar23) * (sVar23 < 0x100) * auVar82[4] - (0xff < sVar23);
    auVar62[0] = (0 < sVar22) * (sVar22 < 0x100) * auVar86[4] - (0xff < sVar22);
    auVar61._2_12_ = auVar62;
    auVar61[1] = (0 < sVar21) * (sVar21 < 0x100) * auVar82[2] - (0xff < sVar21);
    auVar61[0] = (0 < sVar20) * (sVar20 < 0x100) * auVar86[2] - (0xff < sVar20);
    auVar76._0_2_ =
         CONCAT11((0 < sVar32) * (sVar32 < 0x100) * auVar82[0] - (0xff < sVar32),
                  (0 < sVar18) * (sVar18 < 0x100) * auVar86[0] - (0xff < sVar18));
    auVar76._2_14_ = auVar61;
    uVar7 = CONCAT31(CONCAT21(CONCAT11(cVar17,cVar17),cVar16),cVar16);
    uVar69 = CONCAT51(CONCAT41(uVar7,cVar15),cVar15);
    Var68 = CONCAT72(CONCAT61(uVar69,cVar14),CONCAT11(cVar14,cVar17));
    Var66 = CONCAT91(CONCAT81((long)((unkuint9)Var68 >> 8),cVar13),cVar13);
    auVar65._2_10_ = Var66;
    auVar65[1] = cVar12;
    auVar65[0] = cVar12;
    auVar64._2_12_ = auVar65;
    auVar64[1] = cVar11;
    auVar64[0] = cVar11;
    auVar77[3] = cVar10;
    auVar77[2] = cVar10;
    auVar80._0_12_ = auVar76._0_12_;
    auVar80._12_2_ = (short)Var63;
    auVar80._14_2_ = (short)Var66;
    auVar79._12_4_ = auVar80._12_4_;
    auVar79._0_10_ = auVar76._0_10_;
    auVar79._10_2_ = auVar65._0_2_;
    auVar78._10_6_ = auVar79._10_6_;
    auVar78._0_8_ = auVar76._0_8_;
    auVar78._8_2_ = auVar62._0_2_;
    auVar77._8_8_ = auVar78._8_8_;
    auVar77._6_2_ = auVar64._0_2_;
    auVar77._4_2_ = auVar61._0_2_;
    auVar77._0_2_ = auVar76._0_2_;
    auVar84._2_2_ = (short)((unkuint9)Var68 >> 8);
    auVar84._0_2_ = (short)((unkuint9)Var67 >> 8);
    auVar84._4_2_ = (short)uVar60;
    auVar84._6_2_ = (short)uVar69;
    auVar84._8_2_ = (short)uVar6;
    auVar84._10_2_ = (short)uVar7;
    auVar84._12_2_ = uVar81;
    auVar84._14_2_ = CONCAT11(cVar17,cVar17);
    auVar86 = pshufb(auVar77,(undefined1  [16])auVar71);
    auVar82 = pshufb(auVar84,(undefined1  [16])auVar70);
    auVar34._16_16_ = auVar82;
    auVar34._0_16_ = auVar86;
    *(long *)dst_rgb24 = auVar86._0_8_;
    *(undefined1 (*) [16])(dst_rgb24 + 8) = auVar34._12_16_;
    dst_rgb24 = dst_rgb24 + 0x18;
    iVar73 = width + -8;
    bVar8 = 7 < width;
    width = iVar73;
  } while (iVar73 != 0 && bVar8);
  return;
}

Assistant:

void OMITFP I422ToRGB24Row_SSSE3(const uint8_t* y_buf,
                                 const uint8_t* u_buf,
                                 const uint8_t* v_buf,
                                 uint8_t* dst_rgb24,
                                 const struct YuvConstants* yuvconstants,
                                 int width) {
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "movdqa      %[kShuffleMaskARGBToRGB24_0],%%xmm5 \n"
      "movdqa      %[kShuffleMaskARGBToRGB24],%%xmm6 \n"
      "sub         %[u_buf],%[v_buf]             \n"

    LABELALIGN
      "1:                                        \n"
    READYUV422
    YUVTORGB(yuvconstants)
      "punpcklbw   %%xmm1,%%xmm0                 \n"
      "punpcklbw   %%xmm2,%%xmm2                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpcklwd   %%xmm2,%%xmm0                 \n"
      "punpckhwd   %%xmm2,%%xmm1                 \n"
      "pshufb      %%xmm5,%%xmm0                 \n"
      "pshufb      %%xmm6,%%xmm1                 \n"
      "palignr     $0xc,%%xmm0,%%xmm1            \n"
      "movq        %%xmm0,(%[dst_rgb24])         \n"
      "movdqu      %%xmm1,0x8(%[dst_rgb24])      \n"
      "lea         0x18(%[dst_rgb24]),%[dst_rgb24] \n"
      "subl        $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [dst_rgb24]"+r"(dst_rgb24),  // %[dst_rgb24]
#if defined(__i386__)
    [width]"+m"(width)     // %[width]
#else
    [width]"+rm"(width)    // %[width]
#endif
  : [yuvconstants]"r"(yuvconstants),  // %[yuvconstants]
    [kShuffleMaskARGBToRGB24_0]"m"(kShuffleMaskARGBToRGB24_0),
    [kShuffleMaskARGBToRGB24]"m"(kShuffleMaskARGBToRGB24)
  : "memory", "cc", YUVTORGB_REGS
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6"
  );
}